

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O2

void __thiscall BeliefSparse::BeliefSparse(BeliefSparse *this,StateDistribution *belief)

{
  *(undefined ***)this = &PTR__BeliefSparse_00603330;
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::compressed_vector(&this->_m_b);
  (**(code **)(*(long *)this + 0x28))(this,belief);
  return;
}

Assistant:

BeliefSparse::BeliefSparse(const StateDistribution& belief)
{
    this->Set(belief);
}